

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O3

pair<lest::options,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
* lest::split_arguments
            (pair<lest::options,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *__return_storage_ptr__,texts *args)

{
  pointer pcVar1;
  text *ptVar2;
  undefined1 uVar3;
  int iVar4;
  undefined8 uVar5;
  runtime_error *this;
  long *plVar6;
  size_type *psVar7;
  undefined1 uVar8;
  undefined1 uVar9;
  pointer pbVar10;
  seed_t sVar11;
  undefined1 uVar12;
  undefined1 uVar13;
  _Alloc_hider _Var14;
  undefined1 uVar15;
  undefined1 uVar16;
  undefined1 uVar17;
  undefined1 uVar18;
  undefined1 uVar19;
  undefined1 uVar20;
  undefined1 uVar21;
  bool bVar22;
  text opt;
  text val;
  text arg;
  texts in;
  int local_224;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220;
  undefined1 *local_200;
  long local_1f8;
  undefined1 local_1f0;
  undefined7 uStack_1ef;
  undefined8 local_1e0;
  undefined8 local_1d8;
  ulong local_1d0;
  undefined8 local_1c8;
  undefined8 local_1c0;
  undefined8 local_1b8;
  undefined8 local_1b0;
  undefined8 local_1a8;
  undefined8 local_1a0;
  undefined8 local_198;
  undefined8 local_190;
  seed_t local_188;
  undefined8 local_180;
  value_type local_178;
  text local_158;
  text local_138;
  text local_118;
  text local_f8;
  text local_d8;
  undefined1 local_b8 [32];
  _Alloc_hider local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_78;
  pair<lest::options,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_78.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pbVar10 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if (pbVar10 ==
      (args->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    local_224 = 1;
    uVar15 = false;
    uVar3 = false;
    uVar16 = false;
    uVar13 = false;
    uVar8 = false;
    uVar12 = false;
    uVar17 = false;
    sVar11 = 0;
    uVar18 = false;
    uVar9 = false;
    uVar21 = false;
    uVar19 = false;
    uVar20 = false;
  }
  else {
    local_224 = 1;
    bVar22 = true;
    local_1a0 = 0;
    local_1a8 = 0;
    local_1b0 = 0;
    local_1c0 = 0;
    local_1b8 = 0;
    local_188 = 0;
    local_180 = 0;
    local_1e0 = 0;
    local_198 = 0;
    local_190 = 0;
    local_1d8 = 0;
    local_1d0 = 0;
    local_1c8 = 0;
    local_58 = __return_storage_ptr__;
    do {
      local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
      local_220._M_string_length = 0;
      local_220.field_2._M_local_buf[0] = '\0';
      local_200 = &local_1f0;
      local_1f8 = 0;
      local_1f0 = 0;
      local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
      pcVar1 = (pbVar10->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_178,pcVar1,pcVar1 + pbVar10->_M_string_length);
      local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_d8,local_178._M_dataplus._M_p,
                 local_178._M_dataplus._M_p + local_178._M_string_length);
      split_option((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_b8,&local_d8);
      std::__cxx11::string::operator=((string *)&local_220,(string *)local_b8);
      std::__cxx11::string::operator=((string *)&local_200,(string *)&local_98);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_p != &local_88) {
        operator_delete(local_98._M_p,local_88._M_allocated_capacity + 1);
      }
      if ((undefined1 *)local_b8._0_8_ != local_b8 + 0x10) {
        operator_delete((void *)local_b8._0_8_,local_b8._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
        operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
      }
      if ((bVar22) && (*local_220._M_dataplus._M_p == '-')) {
        iVar4 = std::__cxx11::string::compare((char *)&local_220);
        if (iVar4 == 0) goto LAB_001070f8;
        uVar5 = std::__cxx11::string::compare((char *)&local_220);
        if ((int)uVar5 == 0) {
LAB_0010716b:
          local_1a0 = CONCAT71((int7)((ulong)uVar5 >> 8),1);
LAB_001071a5:
          bVar22 = true;
        }
        else {
          uVar5 = std::__cxx11::string::compare((char *)&local_220);
          if ((int)uVar5 == 0) goto LAB_0010716b;
          uVar5 = std::__cxx11::string::compare((char *)&local_220);
          if ((int)uVar5 == 0) {
LAB_00107177:
            local_1a8 = CONCAT71((int7)((ulong)uVar5 >> 8),1);
            goto LAB_001071a5;
          }
          uVar5 = std::__cxx11::string::compare((char *)&local_220);
          if ((int)uVar5 == 0) goto LAB_00107177;
          uVar5 = std::__cxx11::string::compare((char *)&local_220);
          if ((int)uVar5 == 0) {
LAB_00107183:
            local_1b0 = CONCAT71((int7)((ulong)uVar5 >> 8),1);
            goto LAB_001071a5;
          }
          uVar5 = std::__cxx11::string::compare((char *)&local_220);
          if ((int)uVar5 == 0) goto LAB_00107183;
          uVar5 = std::__cxx11::string::compare((char *)&local_220);
          if ((int)uVar5 == 0) {
LAB_0010718c:
            local_1b8 = CONCAT71((int7)((ulong)uVar5 >> 8),1);
            goto LAB_001071a5;
          }
          uVar5 = std::__cxx11::string::compare((char *)&local_220);
          if ((int)uVar5 == 0) goto LAB_0010718c;
          uVar5 = std::__cxx11::string::compare((char *)&local_220);
          if ((int)uVar5 == 0) {
LAB_00107195:
            local_1c0 = CONCAT71((int7)((ulong)uVar5 >> 8),1);
            goto LAB_001071a5;
          }
          uVar5 = std::__cxx11::string::compare((char *)&local_220);
          if ((int)uVar5 == 0) goto LAB_00107195;
          uVar5 = std::__cxx11::string::compare((char *)&local_220);
          if ((int)uVar5 == 0) {
LAB_0010719e:
            local_1c8 = CONCAT71((int7)((ulong)uVar5 >> 8),1);
            goto LAB_001071a5;
          }
          uVar5 = std::__cxx11::string::compare((char *)&local_220);
          if ((int)uVar5 == 0) goto LAB_0010719e;
          uVar5 = std::__cxx11::string::compare((char *)&local_220);
          bVar22 = true;
          if ((int)uVar5 != 0) {
            uVar5 = std::__cxx11::string::compare((char *)&local_220);
            if ((int)uVar5 == 0) goto LAB_001071ad;
            uVar5 = std::__cxx11::string::compare((char *)&local_220);
            if ((int)uVar5 != 0) {
              uVar5 = std::__cxx11::string::compare((char *)&local_220);
              if ((int)uVar5 == 0) goto LAB_001071b9;
              uVar5 = std::__cxx11::string::compare((char *)&local_220);
              if ((int)uVar5 == 0) {
LAB_001071c2:
                local_1e0 = CONCAT71((int7)((ulong)uVar5 >> 8),1);
                goto LAB_001071a5;
              }
              uVar5 = std::__cxx11::string::compare((char *)&local_220);
              if ((int)uVar5 == 0) goto LAB_001071c2;
              uVar5 = std::__cxx11::string::compare((char *)&local_220);
              bVar22 = true;
              if ((int)uVar5 != 0) {
                iVar4 = std::__cxx11::string::compare((char *)&local_220);
                if (iVar4 == 0) {
                  iVar4 = std::__cxx11::string::compare((char *)&local_200);
                  if (iVar4 == 0) goto LAB_001070fb;
                }
                iVar4 = std::__cxx11::string::compare((char *)&local_220);
                if (iVar4 != 0) {
LAB_00106fdb:
                  iVar4 = std::__cxx11::string::compare((char *)&local_220);
                  if (iVar4 == 0) {
                    uVar5 = std::__cxx11::string::compare((char *)&local_200);
                    if ((int)uVar5 == 0) {
                      local_198 = CONCAT71((int7)((ulong)uVar5 >> 8),1);
                      goto LAB_001071a5;
                    }
                  }
                  iVar4 = std::__cxx11::string::compare((char *)&local_220);
                  if (iVar4 == 0) {
                    local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&local_f8,"--random-seed","");
                    local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
                    std::__cxx11::string::_M_construct<char*>
                              ((string *)&local_138,local_200,local_200 + local_1f8);
                    local_188 = seed(&local_f8,&local_138);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_138._M_dataplus._M_p != &local_138.field_2) {
                      operator_delete(local_138._M_dataplus._M_p,
                                      local_138.field_2._M_allocated_capacity + 1);
                    }
                    ptVar2 = &local_f8;
                    _Var14._M_p = local_f8._M_dataplus._M_p;
                  }
                  else {
                    iVar4 = std::__cxx11::string::compare((char *)&local_220);
                    if (iVar4 != 0) {
                      this = (runtime_error *)__cxa_allocate_exception(0x10);
                      std::operator+(&local_50,"unrecognised option \'",&local_220);
                      plVar6 = (long *)std::__cxx11::string::append((char *)&local_50);
                      local_b8._0_8_ = *plVar6;
                      psVar7 = (size_type *)(plVar6 + 2);
                      if ((size_type *)local_b8._0_8_ == psVar7) {
                        local_b8._16_8_ = *psVar7;
                        local_b8._24_8_ = plVar6[3];
                        local_b8._0_8_ = local_b8 + 0x10;
                      }
                      else {
                        local_b8._16_8_ = *psVar7;
                      }
                      local_b8._8_8_ = plVar6[1];
                      *plVar6 = (long)psVar7;
                      plVar6[1] = 0;
                      *(undefined1 *)(plVar6 + 2) = 0;
                      std::runtime_error::runtime_error(this,(string *)local_b8);
                      __cxa_throw(this,&std::runtime_error::typeinfo,
                                  std::runtime_error::~runtime_error);
                    }
                    local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&local_118,"--repeat","");
                    local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
                    std::__cxx11::string::_M_construct<char*>
                              ((string *)&local_158,local_200,local_200 + local_1f8);
                    local_224 = repeat(&local_118,&local_158);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_158._M_dataplus._M_p != &local_158.field_2) {
                      operator_delete(local_158._M_dataplus._M_p,
                                      local_158.field_2._M_allocated_capacity + 1);
                    }
                    ptVar2 = &local_118;
                    _Var14._M_p = local_118._M_dataplus._M_p;
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)_Var14._M_p != &ptVar2->field_2) {
                    operator_delete(_Var14._M_p,(ptVar2->field_2)._M_allocated_capacity + 1);
                  }
                  goto LAB_001070fb;
                }
                uVar5 = std::__cxx11::string::compare((char *)&local_200);
                if ((int)uVar5 != 0) goto LAB_00106fdb;
                local_190 = CONCAT71((int7)((ulong)uVar5 >> 8),1);
                goto LAB_001071a5;
              }
              local_180 = CONCAT71((int7)((ulong)uVar5 >> 8),1);
              goto LAB_001070fb;
            }
LAB_001071b9:
            local_1d8 = CONCAT71((int7)((ulong)uVar5 >> 8),1);
            goto LAB_001071a5;
          }
LAB_001071ad:
          local_1d0 = CONCAT71((int7)((ulong)uVar5 >> 8),1);
        }
      }
      else {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&local_78,&local_178);
LAB_001070f8:
        bVar22 = false;
      }
LAB_001070fb:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_178._M_dataplus._M_p != &local_178.field_2) {
        operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1);
      }
      if (local_200 != &local_1f0) {
        operator_delete(local_200,CONCAT71(uStack_1ef,local_1f0) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_220._M_dataplus._M_p != &local_220.field_2) {
        operator_delete(local_220._M_dataplus._M_p,
                        CONCAT71(local_220.field_2._M_allocated_capacity._1_7_,
                                 local_220.field_2._M_local_buf[0]) + 1);
      }
      pbVar10 = pbVar10 + 1;
    } while (pbVar10 !=
             (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish);
    uVar16 = (undefined1)local_1d8;
    uVar3 = 1;
    if ((local_1d0 & 1) == 0) {
      uVar3 = uVar16;
    }
    uVar8 = (undefined1)local_198;
    uVar12 = (undefined1)local_1e0;
    uVar13 = (undefined1)local_190;
    uVar15 = (undefined1)local_1c8;
    uVar17 = (undefined1)local_180;
    uVar18 = (undefined1)local_1b8;
    uVar9 = (undefined1)local_1c0;
    uVar21 = (undefined1)local_1b0;
    uVar19 = (undefined1)local_1a8;
    uVar20 = (undefined1)local_1a0;
    sVar11 = local_188;
    __return_storage_ptr__ = local_58;
  }
  (__return_storage_ptr__->first).help = (bool)uVar20;
  (__return_storage_ptr__->first).abort = (bool)uVar19;
  (__return_storage_ptr__->first).count = (bool)uVar21;
  (__return_storage_ptr__->first).list = (bool)uVar9;
  (__return_storage_ptr__->first).tags = (bool)uVar18;
  (__return_storage_ptr__->first).time = (bool)uVar15;
  (__return_storage_ptr__->first).pass = (bool)uVar3;
  (__return_storage_ptr__->first).zen = (bool)uVar16;
  (__return_storage_ptr__->first).lexical = (bool)uVar13;
  (__return_storage_ptr__->first).random = (bool)uVar8;
  (__return_storage_ptr__->first).verbose = (bool)uVar12;
  (__return_storage_ptr__->first).version = (bool)uVar17;
  (__return_storage_ptr__->first).repeat = local_224;
  (__return_storage_ptr__->first).seed = sVar11;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&__return_storage_ptr__->second,&local_78);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_78);
  return __return_storage_ptr__;
}

Assistant:

inline std::pair<options, texts>
split_arguments( texts args )
{
    options option; texts in;

    bool in_options = true;

    for ( texts::iterator pos = args.begin(); pos != args.end() ; ++pos )
    {
        text opt, val, arg = *pos;
        tie( opt, val ) = split_option( arg );

        if ( in_options )
        {
            if      ( opt[0] != '-'                             ) { in_options     = false;           }
            else if ( opt == "--"                               ) { in_options     = false; continue; }
            else if ( opt == "-h"      || "--help"       == opt ) { option.help    =  true; continue; }
            else if ( opt == "-a"      || "--abort"      == opt ) { option.abort   =  true; continue; }
            else if ( opt == "-c"      || "--count"      == opt ) { option.count   =  true; continue; }
            else if ( opt == "-g"      || "--list-tags"  == opt ) { option.tags    =  true; continue; }
            else if ( opt == "-l"      || "--list-tests" == opt ) { option.list    =  true; continue; }
            else if ( opt == "-t"      || "--time"       == opt ) { option.time    =  true; continue; }
            else if ( opt == "-p"      || "--pass"       == opt ) { option.pass    =  true; continue; }
            else if ( opt == "-z"      || "--pass-zen"   == opt ) { option.zen     =  true; continue; }
            else if ( opt == "-v"      || "--verbose"    == opt ) { option.verbose =  true; continue; }
            else if (                     "--version"    == opt ) { option.version =  true; continue; }
            else if ( opt == "--order" && "declared"     == val ) { /* by definition */   ; continue; }
            else if ( opt == "--order" && "lexical"      == val ) { option.lexical =  true; continue; }
            else if ( opt == "--order" && "random"       == val ) { option.random  =  true; continue; }
            else if ( opt == "--random-seed" ) { option.seed   = seed  ( "--random-seed", val ); continue; }
            else if ( opt == "--repeat"      ) { option.repeat = repeat( "--repeat"     , val ); continue; }
            else throw std::runtime_error( "unrecognised option '" + opt + "' (try option --help)" );
        }
        in.push_back( arg );
    }
    option.pass = option.pass || option.zen;

    return std::make_pair( option, in );
}